

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus_settings.cpp
# Opt level: O0

void __thiscall CMenus::RenderThemeSelection(CMenus *this,CUIRect MainView,bool Header)

{
  bool bVar1;
  int iVar2;
  CConfig *pCVar3;
  IStorage *pIVar4;
  CTheme *pCVar5;
  CUI *this_00;
  IGraphics *pIVar6;
  char *pcVar7;
  byte in_SIL;
  long in_RDI;
  uint uVar8;
  long in_FS_OFFSET;
  CTheme *Theme;
  int OldSelected;
  int i;
  int SelectedTheme;
  CQuadItem QuadItem;
  CUIRect Icon;
  CListboxItem Item;
  range r;
  bool IsActive;
  char aName [128];
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  char *in_stack_fffffffffffffe00;
  CListBox *this_01;
  undefined4 in_stack_fffffffffffffe08;
  float FontSize;
  undefined4 in_stack_fffffffffffffe0c;
  float in_stack_fffffffffffffe10;
  undefined2 in_stack_fffffffffffffe14;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  CUIRect *in_stack_fffffffffffffe18;
  CUI *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  char *in_stack_fffffffffffffe30;
  CListBox *in_stack_fffffffffffffe38;
  CTheme *in_stack_fffffffffffffe50;
  sorted_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_> *in_stack_fffffffffffffe58;
  int local_13c;
  int local_138;
  CQuadItem local_118;
  uint local_108;
  float local_104;
  float local_100;
  float local_fc;
  float in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  plain_range<CMenus::CTheme> local_e0;
  undefined1 local_c9 [193];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((RenderThemeSelection(CUIRect,bool)::s_ListBox == '\0') &&
     (iVar2 = __cxa_guard_acquire(&RenderThemeSelection(CUIRect,bool)::s_ListBox), iVar2 != 0)) {
    CListBox::CListBox((CListBox *)in_stack_fffffffffffffe20);
    __cxa_atexit(CListBox::~CListBox,&RenderThemeSelection::s_ListBox,&__dso_handle);
    __cxa_guard_release(&RenderThemeSelection(CUIRect,bool)::s_ListBox);
  }
  iVar2 = array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::size
                    ((array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_> *)(in_RDI + 0x288));
  if (iVar2 == 0) {
    pCVar3 = CComponent::Config((CComponent *)0x1a41fa);
    if (pCVar3->m_ClShowMenuMap == 0) {
      CComponent::Config((CComponent *)0x1a4210);
      str_copy(in_stack_fffffffffffffe00,
               (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0);
    }
    CTheme::CTheme((CTheme *)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                   (bool)in_stack_fffffffffffffe17,(bool)in_stack_fffffffffffffe16);
    sorted_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::add
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    CTheme::~CTheme((CTheme *)0x1a42b0);
    CTheme::CTheme((CTheme *)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                   (bool)in_stack_fffffffffffffe17,(bool)in_stack_fffffffffffffe16);
    sorted_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::add
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    CTheme::~CTheme((CTheme *)0x1a430a);
    pIVar4 = CComponent::Storage((CComponent *)0x1a4317);
    (*(pIVar4->super_IInterface)._vptr_IInterface[2])
              (pIVar4,0xffffffff,"ui/themes",ThemeScan,in_RDI);
    pIVar4 = CComponent::Storage((CComponent *)0x1a4348);
    (*(pIVar4->super_IInterface)._vptr_IInterface[2])
              (pIVar4,0xffffffff,"ui/themes",ThemeIconScan,in_RDI);
  }
  local_138 = -1;
  local_13c = 0;
  do {
    iVar2 = array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::size
                      ((array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_> *)(in_RDI + 0x288)
                      );
    if (iVar2 <= local_13c) {
LAB_001a4483:
      if ((in_SIL & 1) != 0) {
        Localize((char *)CONCAT17(in_stack_fffffffffffffe17,
                                  CONCAT16(in_stack_fffffffffffffe16,
                                           CONCAT24(in_stack_fffffffffffffe14,
                                                    in_stack_fffffffffffffe10))),
                 (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        this_00 = CComponent::UI((CComponent *)0x1a44c3);
        CUI::GetListHeaderHeight(this_00);
        CListBox::DoHeader((CListBox *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                           ,(CUIRect *)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                           (float)CONCAT13(in_stack_fffffffffffffe17,
                                           CONCAT12(in_stack_fffffffffffffe16,
                                                    in_stack_fffffffffffffe14)),
                           in_stack_fffffffffffffe10);
      }
      local_c9[0] = *(int *)(in_RDI + 0x38) == 2;
      array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::size
                ((array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_> *)(in_RDI + 0x288));
      this_01 = (CListBox *)local_c9;
      uVar8 = (uint)(in_SIL & 1);
      FontSize = 2.10195e-44;
      CListBox::DoStart(in_stack_fffffffffffffe38,(float)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                        (int)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                        in_stack_fffffffffffffe28,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                        in_stack_fffffffffffffe18,(bool)in_stack_fffffffffffffe17,
                        (bool *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                        in_stack_ffffffffffffff10);
      local_e0 = (plain_range<CMenus::CTheme>)
                 sorted_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::all
                           ((sorted_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_> *)
                            CONCAT44(in_stack_fffffffffffffe0c,FontSize));
      while (bVar1 = plain_range<CMenus::CTheme>::empty(&local_e0), ((bVar1 ^ 0xffU) & 1) != 0) {
        pCVar5 = plain_range<CMenus::CTheme>::front((plain_range<CMenus::CTheme> *)this_01);
        array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::base_ptr
                  ((array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_> *)(in_RDI + 0x288));
        CListBox::DoNextItem
                  (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                   SUB41((uint)in_stack_fffffffffffffe2c >> 0x18,0),
                   &in_stack_fffffffffffffe20->m_Enabled);
        if ((local_c9[0] & 1) != 0) {
          *(undefined4 *)(in_RDI + 0x38) = 2;
        }
        if ((in_stack_ffffffffffffff0c & 1) != 0) {
          CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe0c,FontSize),
                              (float)((ulong)this_01 >> 0x20),
                              (CUIRect *)CONCAT44(in_stack_fffffffffffffdfc,uVar8),
                              (CUIRect *)0x1a46cd);
          bVar1 = IGraphics::CTextureHandle::IsValid((CTextureHandle *)0x1a46de);
          if (bVar1) {
            CUIRect::VMargin((CUIRect *)CONCAT44(in_stack_fffffffffffffe0c,FontSize),
                             (float)((ulong)this_01 >> 0x20),
                             (CUIRect *)CONCAT44(in_stack_fffffffffffffdfc,uVar8));
            CUIRect::HMargin((CUIRect *)CONCAT44(in_stack_fffffffffffffe0c,FontSize),
                             (float)((ulong)this_01 >> 0x20),
                             (CUIRect *)CONCAT44(in_stack_fffffffffffffdfc,uVar8));
            pIVar6 = CComponent::Graphics((CComponent *)0x1a4724);
            local_108 = (pCVar5->m_IconTexture).m_Id;
            (*(pIVar6->super_IInterface)._vptr_IInterface[0x13])(pIVar6,(ulong)local_108);
            pIVar6 = CComponent::Graphics((CComponent *)0x1a4756);
            (*(pIVar6->super_IInterface)._vptr_IInterface[0x17])();
            pIVar6 = CComponent::Graphics((CComponent *)0x1a476f);
            (*(pIVar6->super_IInterface)._vptr_IInterface[0x21])(0x3f800000,0x3f800000,0x3f800000);
            IGraphics::CQuadItem::CQuadItem
                      (&local_118,local_104,local_100,local_fc,in_stack_ffffffffffffff08);
            pIVar6 = CComponent::Graphics((CComponent *)0x1a47ca);
            (*(pIVar6->super_IInterface)._vptr_IInterface[0x1d])(pIVar6,&local_118,1);
            pIVar6 = CComponent::Graphics((CComponent *)0x1a47f0);
            (*(pIVar6->super_IInterface)._vptr_IInterface[0x18])();
          }
          pcVar7 = string_base::operator_cast_to_char_((string_base *)pCVar5);
          if (*pcVar7 == '\0') {
            str_copy((char *)this_01,(char *)CONCAT44(in_stack_fffffffffffffdfc,uVar8),0);
          }
          else {
            string_base::operator_cast_to_char_((string_base *)pCVar5);
            iVar2 = str_comp((char *)this_01,(char *)CONCAT44(in_stack_fffffffffffffdfc,uVar8));
            if (iVar2 == 0) {
              str_copy((char *)this_01,(char *)CONCAT44(in_stack_fffffffffffffdfc,uVar8),0);
            }
            else if (((pCVar5->m_HasDay & 1U) == 0) || ((pCVar5->m_HasNight & 1U) == 0)) {
              if (((pCVar5->m_HasDay & 1U) == 0) || ((pCVar5->m_HasNight & 1U) != 0)) {
                if (((pCVar5->m_HasDay & 1U) == 0) && ((pCVar5->m_HasNight & 1U) != 0)) {
                  in_stack_fffffffffffffe38 = (CListBox *)(local_c9 + 0x41);
                  pcVar7 = string_base<allocator_default<char>_>::cstr(&pCVar5->m_Name);
                  str_format((char *)in_stack_fffffffffffffe38,0x80,"%s (night)",pcVar7);
                }
                else {
                  in_stack_fffffffffffffe30 = local_c9 + 0x41;
                  pcVar7 = string_base<allocator_default<char>_>::cstr(&pCVar5->m_Name);
                  str_format(in_stack_fffffffffffffe30,0x80,"%s",pcVar7);
                }
              }
              else {
                pcVar7 = string_base<allocator_default<char>_>::cstr(&pCVar5->m_Name);
                str_format(local_c9 + 0x41,0x80,"%s (day)",pcVar7);
              }
            }
            else {
              pcVar7 = string_base<allocator_default<char>_>::cstr(&pCVar5->m_Name);
              str_format(local_c9 + 0x41,0x80,"%s",pcVar7);
            }
          }
          CComponent::UI((CComponent *)0x1a49b4);
          CUI::DoLabelSelected
                    (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                     (char *)CONCAT17(in_stack_fffffffffffffe17,
                                      CONCAT16(in_stack_fffffffffffffe16,
                                               CONCAT24(in_stack_fffffffffffffe14,
                                                        in_stack_fffffffffffffe10))),
                     SUB41((uint)in_stack_fffffffffffffe0c >> 0x18,0),FontSize,
                     (int)((ulong)this_01 >> 0x20));
        }
        plain_range<CMenus::CTheme>::pop_front((plain_range<CMenus::CTheme> *)this_01);
      }
      iVar2 = CListBox::DoEnd(this_01);
      if (local_138 != iVar2) {
        *(undefined4 *)(in_RDI + 0x38) = 2;
        CComponent::Config((CComponent *)0x1a4a4f);
        pCVar5 = array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::operator[]
                           ((array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_> *)
                            (in_RDI + 0x288),iVar2);
        string_base::operator_cast_to_char_((string_base *)pCVar5);
        str_copy((char *)this_01,(char *)CONCAT44(in_stack_fffffffffffffdfc,uVar8),0);
        pCVar5 = array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::operator[]
                           ((array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_> *)
                            (in_RDI + 0x288),iVar2);
        pcVar7 = string_base::operator_cast_to_char_((string_base *)pCVar5);
        uVar8 = (uint)(*pcVar7 != '\0');
        pCVar3 = CComponent::Config((CComponent *)0x1a4ad2);
        pCVar3->m_ClShowMenuMap = uVar8;
        CMapLayers::BackgroundMapUpdate((CMapLayers *)this_01);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    pCVar5 = array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::operator[]
                       ((array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_> *)
                        (in_RDI + 0x288),local_13c);
    string_base::operator_cast_to_char_((string_base *)pCVar5);
    CComponent::Config((CComponent *)0x1a443f);
    iVar2 = str_comp(in_stack_fffffffffffffe00,
                     (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    if (iVar2 == 0) {
      local_138 = local_13c;
      goto LAB_001a4483;
    }
    local_13c = local_13c + 1;
  } while( true );
}

Assistant:

void CMenus::RenderThemeSelection(CUIRect MainView, bool Header)
{
	static CListBox s_ListBox;

	if(m_lThemes.size() == 0) // not loaded yet
	{
		if(!Config()->m_ClShowMenuMap)
			str_copy(Config()->m_ClMenuMap, "", sizeof(Config()->m_ClMenuMap)); // cl_menu_map otherwise resets to default on loading
		m_lThemes.add(CTheme("", false, false)); // no theme
		m_lThemes.add(CTheme("auto", false, false)); // auto theme
		Storage()->ListDirectory(IStorage::TYPE_ALL, "ui/themes", ThemeScan, (CMenus*)this);
		Storage()->ListDirectory(IStorage::TYPE_ALL, "ui/themes", ThemeIconScan, (CMenus*)this);
	}

	int SelectedTheme = -1;
	for(int i = 0; i < m_lThemes.size(); i++)
		if(str_comp(m_lThemes[i].m_Name, Config()->m_ClMenuMap) == 0)
		{
			SelectedTheme = i;
			break;
		}
	const int OldSelected = SelectedTheme;

	if(Header)
		s_ListBox.DoHeader(&MainView, Localize("Theme"), UI()->GetListHeaderHeight());

	bool IsActive = m_ActiveListBox == ACTLB_THEME;
	s_ListBox.DoStart(20.0f, m_lThemes.size(), 1, 3, SelectedTheme, Header?0:&MainView, Header, &IsActive);

	for(sorted_array<CTheme>::range r = m_lThemes.all(); !r.empty(); r.pop_front())
	{
		const CTheme& Theme = r.front();
		CListboxItem Item = s_ListBox.DoNextItem(&Theme, SelectedTheme == (&Theme-m_lThemes.base_ptr()), &IsActive);
		if(IsActive)
			m_ActiveListBox = ACTLB_THEME;

		if(!Item.m_Visible)
			continue;

		CUIRect Icon;
		Item.m_Rect.VSplitLeft(Item.m_Rect.h*2.0f, &Icon, &Item.m_Rect);

		// draw icon if it exists
		if(Theme.m_IconTexture.IsValid())
		{
			Icon.VMargin(6.0f, &Icon);
			Icon.HMargin(3.0f, &Icon);
			Graphics()->TextureSet(Theme.m_IconTexture);
			Graphics()->QuadsBegin();
			Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
			IGraphics::CQuadItem QuadItem(Icon.x, Icon.y, Icon.w, Icon.h);
			Graphics()->QuadsDrawTL(&QuadItem, 1);
			Graphics()->QuadsEnd();
		}

		char aName[128];
		if(!Theme.m_Name[0])
			str_copy(aName, "(none)", sizeof(aName));
		else if(str_comp(Theme.m_Name, "auto") == 0)
			str_copy(aName, "(automatic)", sizeof(aName));
		else if(Theme.m_HasDay && Theme.m_HasNight)
			str_format(aName, sizeof(aName), "%s", Theme.m_Name.cstr());
		else if(Theme.m_HasDay && !Theme.m_HasNight)
			str_format(aName, sizeof(aName), "%s (day)", Theme.m_Name.cstr());
		else if(!Theme.m_HasDay && Theme.m_HasNight)
			str_format(aName, sizeof(aName), "%s (night)", Theme.m_Name.cstr());
		else // generic
			str_format(aName, sizeof(aName), "%s", Theme.m_Name.cstr());

		UI()->DoLabelSelected(&Item.m_Rect, aName, Item.m_Selected, Item.m_Rect.h*CUI::ms_FontmodHeight*0.8f, TEXTALIGN_ML);
	}

	SelectedTheme = s_ListBox.DoEnd();

	if(OldSelected != SelectedTheme)
	{
		m_ActiveListBox = ACTLB_THEME;
		str_copy(Config()->m_ClMenuMap, m_lThemes[SelectedTheme].m_Name, sizeof(Config()->m_ClMenuMap));
		Config()->m_ClShowMenuMap = m_lThemes[SelectedTheme].m_Name[0] ? 1 : 0;
		m_pClient->m_pMapLayersBackGround->BackgroundMapUpdate();
	}
}